

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

ulong __thiscall nuraft::raft_server::get_last_snapshot_idx(raft_server *this)

{
  element_type *peVar1;
  ulong uVar2;
  
  std::mutex::lock(&this->last_snapshot_lock_);
  peVar1 = (this->last_snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = peVar1->last_log_idx_;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->last_snapshot_lock_);
  return uVar2;
}

Assistant:

ulong raft_server::get_last_snapshot_idx() const {
    std::lock_guard<std::mutex> l(last_snapshot_lock_);
    return last_snapshot_ ? last_snapshot_->get_last_log_idx(): 0;
}